

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

Status __thiscall wallet::SQLiteCursor::Next(SQLiteCursor *this,DataStream *key,DataStream *value)

{
  long lVar1;
  pointer pbVar2;
  string_view source_file;
  bool bVar3;
  int iVar4;
  Logger *pLVar5;
  size_t in_RCX;
  Status SVar6;
  char **in_R8;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view str;
  Span<const_std::byte> SVar7;
  undefined8 local_d8 [14];
  string local_68;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = sqlite3_step(this->m_cursor_stmt);
  if (iVar4 == 100) {
    pbVar2 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish != pbVar2) {
      (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = pbVar2;
    }
    key->m_read_pos = 0;
    pbVar2 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish != pbVar2) {
      (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = pbVar2;
    }
    value->m_read_pos = 0;
    SVar7 = SpanFromBlob(this->m_cursor_stmt,0);
    DataStream::write(key,(int)SVar7.m_data,(void *)SVar7.m_size,in_RCX);
    SVar6 = MORE;
    SVar7 = SpanFromBlob(this->m_cursor_stmt,1);
    DataStream::write(value,(int)SVar7.m_data,(void *)SVar7.m_size,in_RCX);
  }
  else if (iVar4 == 0x65) {
    SVar6 = DONE;
  }
  else {
    local_d8[0] = sqlite3_errstr(iVar4);
    pLVar5 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar5);
    if (bVar3) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<char[5],char_const*>
                (&local_68,(tinyformat *)"%s: Unable to execute cursor step: %s\n","Next",
                 (char (*) [5])local_d8,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      pLVar5 = LogInstance();
      local_68._M_dataplus._M_p = (pointer)0x5a;
      local_68._M_string_length = 0x3f7ed7;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
      ;
      source_file._M_len = 0x5a;
      logging_function._M_str = "Next";
      logging_function._M_len = 4;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x23a,ALL,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    SVar6 = FAIL;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar6;
  }
  __stack_chk_fail();
}

Assistant:

DatabaseCursor::Status SQLiteCursor::Next(DataStream& key, DataStream& value)
{
    int res = sqlite3_step(m_cursor_stmt);
    if (res == SQLITE_DONE) {
        return Status::DONE;
    }
    if (res != SQLITE_ROW) {
        LogPrintf("%s: Unable to execute cursor step: %s\n", __func__, sqlite3_errstr(res));
        return Status::FAIL;
    }

    key.clear();
    value.clear();

    // Leftmost column in result is index 0
    key.write(SpanFromBlob(m_cursor_stmt, 0));
    value.write(SpanFromBlob(m_cursor_stmt, 1));
    return Status::MORE;
}